

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O1

string * __thiscall
cmInstallFilesGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallFilesGenerator *this,string *config)

{
  char *pcVar1;
  allocator local_69;
  undefined1 local_68 [16];
  PositionType local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  cmGeneratorExpression ge;
  
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)(local_68 + 8));
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)(local_68 + 8));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_68 + 8));
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_68,(string *)&ge);
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_68._8_8_ = &local_50;
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)local_68._0_8_,this->LocalGenerator,config,
                      false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(string *)(local_68 + 8));
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_69);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._8_8_ != &local_50) {
    operator_delete((void *)local_68._8_8_,
                    CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) + 1);
  }
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_68);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallFilesGenerator::GetDestination(
  std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)->Evaluate(this->LocalGenerator, config);
}